

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

int ON_UuidPair::Compare(ON_UuidPair *a,ON_UuidPair *b)

{
  int local_24;
  int i;
  ON_UuidPair *b_local;
  ON_UuidPair *a_local;
  
  if (a == (ON_UuidPair *)0x0) {
    a_local._4_4_ = 0;
    if (b != (ON_UuidPair *)0x0) {
      a_local._4_4_ = -1;
    }
  }
  else if (b == (ON_UuidPair *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    local_24 = ON_UuidCompare(a->m_uuid,b->m_uuid);
    if (local_24 == 0) {
      local_24 = ON_UuidCompare(a->m_uuid + 1,b->m_uuid + 1);
    }
    a_local._4_4_ = local_24;
  }
  return a_local._4_4_;
}

Assistant:

int ON_UuidPair::Compare(const class ON_UuidPair* a,const class ON_UuidPair* b)
{
  int i;
  if (!a)
  {
    return (b) ? -1 : 0;
  }
  if (!b)
  {
    return 1;
  }
  if ( 0 == (i = ON_UuidCompare(a->m_uuid[0],b->m_uuid[0])) )
  {
    i = ON_UuidCompare(a->m_uuid[1],b->m_uuid[1]);
  }
  return i;
}